

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLSLUtils.cpp
# Opt level: O2

String * __thiscall
Diligent::BuildGLSLSourceString_abi_cxx11_
          (String *__return_storage_ptr__,Diligent *this,BuildGLSLSourceStringAttribs *Attribs)

{
  SHADER_TYPE SVar1;
  ShaderCreateInfo *ShaderCI;
  long lVar2;
  long lVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  ostream *poVar7;
  HLSL2GLSLConverterImpl *this_00;
  char *pcVar8;
  bool IsES;
  SHADER_TYPE local_204;
  ShaderVersion GLSLVer;
  ShaderSourceFileData SourceData;
  String ConvertedSource;
  string msg;
  
  ShaderCI = *(ShaderCreateInfo **)this;
  if (ShaderCI->SourceLanguage < SHADER_SOURCE_LANGUAGE_MSL) {
    ReadShaderSourceFile(&SourceData,ShaderCI);
    if (ShaderCI->SourceLanguage == SHADER_SOURCE_LANGUAGE_GLSL_VERBATIM) {
      if (((ShaderCI->Macros).Elements != (ShaderMacro *)0x0) && ((ShaderCI->Macros).Count != 0)) {
        FormatString<char[55]>
                  (&msg,(char (*) [55])"Shader macros are ignored when compiling GLSL verbatim");
        if (DebugMessageCallback != (undefined *)0x0) {
          (*(code *)DebugMessageCallback)(1,msg._M_dataplus._M_p,0,0,0);
        }
        std::__cxx11::string::~string((string *)&msg);
      }
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)__return_storage_ptr__,SourceData.Source,
                 SourceData.Source + SourceData.SourceLength);
    }
    else {
      GLSLVer.Major = 0;
      GLSLVer.Minor = 0;
      IsES = false;
      GetGLSLVersion(ShaderCI,*(TargetGLSLCompiler *)(this + 0x3c),
                     *(RENDER_DEVICE_TYPE *)(this + 0x18),
                     (RenderDeviceShaderVersionInfo *)(this + 0x1c),&GLSLVer,&IsES);
      SVar1 = (ShaderCI->Desc).ShaderType;
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      std::__cxx11::stringstream::stringstream((stringstream *)&msg);
      poVar7 = std::operator<<((ostream *)msg.field_2._M_local_buf,"#version ");
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
      bVar6 = IsES;
      pcVar8 = "0 core\n";
      if (IsES != false) {
        pcVar8 = "0 es\n";
      }
      std::operator<<(poVar7,pcVar8);
      local_204 = SVar1;
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&ConvertedSource);
      std::__cxx11::string::~string((string *)&ConvertedSource);
      std::__cxx11::stringstream::~stringstream((stringstream *)&msg);
      if (bVar6 != false) {
        lVar2 = *(long *)(this + 8);
        bVar4 = GLSLVer.Minor != 0;
        bVar5 = 1 < GLSLVer.Minor;
        if (GLSLVer.Major != 3) {
          bVar4 = 2 < GLSLVer.Major;
          bVar5 = 2 < GLSLVer.Major;
        }
        if (!(bool)(**(char **)(this + 0x10) == '\0' | bVar4)) {
          std::__cxx11::string::append((char *)__return_storage_ptr__);
        }
        if (*(char *)(lVar2 + 0x127) == '\x01' && !bVar5) {
          std::__cxx11::string::append((char *)__return_storage_ptr__);
        }
        if (((bool)(local_204 == SHADER_TYPE_GEOMETRY & (bVar5 ^ 1U))) ||
           (((local_204 == SHADER_TYPE_DOMAIN || (local_204 == SHADER_TYPE_HULL)) && (!bVar5)))) {
          std::__cxx11::string::append((char *)__return_storage_ptr__);
        }
      }
      if ((ShaderCI->GLSLExtensions != (char *)0x0) && (*ShaderCI->GLSLExtensions != '\0')) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      if (this[0x40] == (Diligent)0x1) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      if (*(long *)(this + 0x48) != 0) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      AppendPlatformDefinition(__return_storage_ptr__);
      AppendShaderTypeDefinitions(__return_storage_ptr__,local_204);
      if (bVar6 != false) {
        lVar2 = *(long *)(this + 8);
        lVar3 = *(long *)(this + 0x10);
        bVar4 = 2 < GLSLVer.Major;
        if (GLSLVer.Major == 3) {
          bVar4 = 1 < GLSLVer.Minor;
        }
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        if (bVar4) {
          std::__cxx11::string::append((char *)__return_storage_ptr__);
        }
        if (*(char *)(lVar2 + 0x127) == '\x01') {
          std::__cxx11::string::append((char *)__return_storage_ptr__);
        }
        if (*(char *)(lVar2 + 0x124) == '\x01') {
          std::__cxx11::string::append((char *)__return_storage_ptr__);
        }
        if ((*(char *)(lVar3 + 4) != '\0') &&
           (std::__cxx11::string::append((char *)__return_storage_ptr__), bVar4)) {
          std::__cxx11::string::append((char *)__return_storage_ptr__);
        }
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      AppendShaderMacros(__return_storage_ptr__,&ShaderCI->Macros);
      if ((((bVar6 != false) && (GLSLVer.Major == 3)) && (GLSLVer.Minor == 0)) &&
         (local_204 == SHADER_TYPE_VERTEX && **(char **)(this + 0x10) != '\0')) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      if (ShaderCI->SourceLanguage == SHADER_SOURCE_LANGUAGE_HLSL) {
        if (((ShaderCI->Desc).UseCombinedTextureSamplers == false) &&
           ((ShaderCI->CompileFlags & SHADER_COMPILE_FLAG_HLSL_TO_SPIRV_VIA_GLSL) ==
            SHADER_COMPILE_FLAG_NONE)) {
          LogError<true,char[70]>
                    (false,"BuildGLSLSourceString",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/GLSLUtils.cpp"
                     ,0x171,(char (*) [70])
                            "Combined texture samplers are required to convert HLSL source to GLSL")
          ;
        }
        this_00 = HLSL2GLSLConverterImpl::GetInstance();
        msg._M_dataplus._M_p = (pointer)ShaderCI->pShaderSourceStreamFactory;
        msg._M_string_length = *(size_type *)(this + 0x50);
        msg.field_2._M_allocated_capacity = (size_type)SourceData.Source;
        msg.field_2._8_8_ = ZEXT48(SourceData.SourceLength);
        HLSL2GLSLConverterImpl::Convert_abi_cxx11_
                  (&ConvertedSource,this_00,(ConversionAttribs *)&msg);
        if (ConvertedSource._M_string_length == 0) {
          LogError<true,char[38]>
                    (false,"BuildGLSLSourceString",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/GLSLUtils.cpp"
                     ,0x18b,(char (*) [38])"Failed to convert HLSL source to GLSL");
        }
        std::__cxx11::string::append((string *)__return_storage_ptr__);
        std::__cxx11::string::~string((string *)&ConvertedSource);
      }
      else {
        std::__cxx11::string::append((char *)__return_storage_ptr__,(ulong)SourceData.Source);
      }
    }
    RefCntAutoPtr<Diligent::IDataBlob>::Release(&SourceData.pFileData);
  }
  else {
    FormatString<char[35]>(&msg,(char (*) [35])"Unsupported shader source language");
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"BuildGLSLSourceString",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/GLSLUtils.cpp"
               ,0x100);
    std::__cxx11::string::~string((string *)&msg);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",(allocator<char> *)&msg);
  }
  return __return_storage_ptr__;
}

Assistant:

String BuildGLSLSourceString(const BuildGLSLSourceStringAttribs& Attribs) noexcept(false)
{
    const ShaderCreateInfo& ShaderCI = Attribs.ShaderCI;

    if (!(ShaderCI.SourceLanguage == SHADER_SOURCE_LANGUAGE_DEFAULT ||
          ShaderCI.SourceLanguage == SHADER_SOURCE_LANGUAGE_GLSL ||
          ShaderCI.SourceLanguage == SHADER_SOURCE_LANGUAGE_GLSL_VERBATIM ||
          ShaderCI.SourceLanguage == SHADER_SOURCE_LANGUAGE_HLSL))
    {
        UNSUPPORTED("Unsupported shader source language");
        return "";
    }

    const ShaderSourceFileData SourceData = ReadShaderSourceFile(ShaderCI);
    if (ShaderCI.SourceLanguage == SHADER_SOURCE_LANGUAGE_GLSL_VERBATIM)
    {
        if (ShaderCI.Macros)
        {
            LOG_WARNING_MESSAGE("Shader macros are ignored when compiling GLSL verbatim");
        }

        return std::string{SourceData.Source, SourceData.SourceLength};
    }

    ShaderVersion GLSLVer;
    bool          IsES = false;
    GetGLSLVersion(ShaderCI, Attribs.TargetCompiler, Attribs.DeviceType, Attribs.MaxShaderVersion, GLSLVer, IsES);

    const SHADER_TYPE ShaderType = ShaderCI.Desc.ShaderType;

    String GLSLSource;
    {
        std::stringstream verss;
        verss << "#version " << Uint32{GLSLVer.Major} << Uint32{GLSLVer.Minor} << (IsES ? "0 es\n" : "0 core\n");
        GLSLSource = verss.str();
    }

    // All extensions must go right after the version directive
    if (IsES)
    {
        AppendGLESExtensions(ShaderType, Attribs.Features, Attribs.AdapterInfo.Texture, GLSLVer, GLSLSource);
    }

    if (ShaderCI.GLSLExtensions != nullptr && ShaderCI.GLSLExtensions[0] != '\0')
    {
        GLSLSource.append(ShaderCI.GLSLExtensions);
        GLSLSource.push_back('\n');
    }

    if (IsES)
    {
        GLSLSource.append("#ifndef GL_ES\n"
                          "#  define GL_ES 1\n"
                          "#endif\n");
    }
    else
    {
        GLSLSource.append("#define DESKTOP_GL 1\n");
    }

    if (Attribs.ZeroToOneClipZ)
    {
        GLSLSource.append("#define _NDC_ZERO_TO_ONE 1\n");
    }

    if (Attribs.ExtraDefinitions != nullptr)
    {
        GLSLSource.append(Attribs.ExtraDefinitions);
    }

    AppendPlatformDefinition(GLSLSource);
    AppendShaderTypeDefinitions(GLSLSource, ShaderType);

    if (IsES)
    {
        AppendPrecisionQualifiers(Attribs.Features, Attribs.AdapterInfo.Texture, GLSLVer, GLSLSource);
    }

    // It would be much more convenient to use row_major matrices.
    // But unfortunately on NVIDIA, the following directive
    // layout(std140, row_major) uniform;
    // does not have any effect on matrices that are part of structures
    // So we have to use column-major matrices which are default in both
    // DX and GLSL.
    GLSLSource.append("layout(std140) uniform;\n");

    AppendShaderMacros(GLSLSource, ShaderCI.Macros);

    if (IsES && GLSLVer == ShaderVersion{3, 0} && Attribs.Features.SeparablePrograms && ShaderType == SHADER_TYPE_VERTEX)
    {
        // From https://www.khronos.org/registry/OpenGL/extensions/EXT/EXT_separate_shader_objects.gles.txt:
        //
        // When using GLSL ES 3.00 shaders in separable programs, gl_Position and
        // gl_PointSize built-in outputs must be redeclared according to Section 7.5
        // of the OpenGL Shading Language Specification...
        //
        // add to GLSL ES 3.00 new section 7.5, Built-In Redeclaration and
        // Separable Programs:
        //
        // "The following vertex shader outputs may be redeclared at global scope to
        // specify a built-in output interface, with or without special qualifiers:
        //
        //     gl_Position
        //     gl_PointSize
        //
        //   When compiling shaders using either of the above variables, both such
        //   variables must be redeclared prior to use.  ((Note:  This restriction
        //   applies only to shaders using version 300 that enable the
        //   EXT_separate_shader_objects extension; shaders not enabling the
        //   extension do not have this requirement.))  A separable program object
        //   will fail to link if any attached shader uses one of the above variables
        //   without redeclaration."
        GLSLSource.append("out vec4 gl_Position;\n");
    }

    if (ShaderCI.SourceLanguage == SHADER_SOURCE_LANGUAGE_HLSL)
    {
#if DILIGENT_NO_HLSL
        LOG_ERROR_AND_THROW("Unable to convert HLSL source to GLSL: HLSL support is disabled");
#else
        if (!ShaderCI.Desc.UseCombinedTextureSamplers && (ShaderCI.CompileFlags & SHADER_COMPILE_FLAG_HLSL_TO_SPIRV_VIA_GLSL) == 0)
        {
            LOG_ERROR_AND_THROW("Combined texture samplers are required to convert HLSL source to GLSL");
        }
        // Convert HLSL to GLSL
        const HLSL2GLSLConverterImpl& Converter = HLSL2GLSLConverterImpl::GetInstance();

        HLSL2GLSLConverterImpl::ConversionAttribs ConvertAttribs;
        ConvertAttribs.pSourceStreamFactory = ShaderCI.pShaderSourceStreamFactory;
        ConvertAttribs.ppConversionStream   = Attribs.ppConversionStream;
        ConvertAttribs.HLSLSource           = SourceData.Source;
        ConvertAttribs.NumSymbols           = SourceData.SourceLength;
        ConvertAttribs.EntryPoint           = ShaderCI.EntryPoint;
        ConvertAttribs.ShaderType           = ShaderCI.Desc.ShaderType;
        ConvertAttribs.IncludeDefinitions   = true;
        ConvertAttribs.InputFileName        = ShaderCI.FilePath;
        ConvertAttribs.SamplerSuffix        = ShaderCI.Desc.CombinedSamplerSuffix != nullptr ?
            ShaderCI.Desc.CombinedSamplerSuffix :
            ShaderDesc{}.CombinedSamplerSuffix;
        // Separate shader objects extension also allows input/output layout qualifiers for
        // all shader stages.
        // https://www.khronos.org/registry/OpenGL/extensions/ARB/ARB_separate_shader_objects.txt
        // (search for "Input Layout Qualifiers" and "Output Layout Qualifiers").
        ConvertAttribs.UseInOutLocationQualifiers = Attribs.Features.SeparablePrograms;
        ConvertAttribs.UseRowMajorMatrices        = (ShaderCI.CompileFlags & SHADER_COMPILE_FLAG_PACK_MATRIX_ROW_MAJOR) != 0;
        String ConvertedSource                    = Converter.Convert(ConvertAttribs);
        if (ConvertedSource.empty())
        {
            LOG_ERROR_AND_THROW("Failed to convert HLSL source to GLSL");
        }
        GLSLSource.append(ConvertedSource);
#endif
    }
    else
    {
        GLSLSource.append(SourceData.Source, SourceData.SourceLength);
    }

    return GLSLSource;
}